

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::SelectGenericLoop<short,short,duckdb::NotEquals,true,true,true>
                (short *ldata,short *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t i;
  idx_t iVar3;
  idx_t iVar4;
  long *plVar5;
  idx_t iVar6;
  idx_t iVar7;
  long *in_stack_00000018;
  long *in_stack_00000020;
  
  iVar6 = 0;
  iVar1 = 0;
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    iVar7 = iVar3;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      iVar7 = (idx_t)result_sel->sel_vector[iVar3];
    }
    iVar2 = iVar3;
    if (lsel->sel_vector != (sel_t *)0x0) {
      iVar2 = (idx_t)lsel->sel_vector[iVar3];
    }
    iVar4 = iVar3;
    if (rsel->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)rsel->sel_vector[iVar3];
    }
    if (ldata[iVar2] == rdata[iVar4]) {
      iVar2 = iVar1;
      iVar1 = iVar6;
      plVar5 = in_stack_00000020;
      iVar6 = iVar6 + 1;
    }
    else {
      iVar2 = iVar1 + 1;
      plVar5 = in_stack_00000018;
    }
    *(int *)(*plVar5 + iVar1 * 4) = (int)iVar7;
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}